

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

FreeFormatParserReturnCode __thiscall
free_format_parser::HMpsFF::parse(HMpsFF *this,HighsLogOptions *log_options,string *filename)

{
  char cVar1;
  bool bVar2;
  Parsekey keyword;
  FreeFormatParserReturnCode FVar3;
  HMpsFF *pHVar4;
  HighsInt colidx;
  size_type __n;
  double dVar5;
  reference rVar6;
  allocator local_371;
  string local_370 [32];
  ifstream f;
  
  FVar3 = kParserError;
  highsLogDev(log_options,kInfo,"readMPS: Trying to open file %s\n",(filename->_M_dataplus)._M_p);
  zstr::ifstream::ifstream(&f);
  std::__cxx11::string::string(local_370,(filename->_M_dataplus)._M_p,&local_371);
  zstr::ifstream::open(&f,(char *)local_370,8);
  std::__cxx11::string::~string(local_370);
  pHVar4 = (HMpsFF *)&f.super_istream.field_0x88;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    highsLogDev(log_options,kInfo,"readMPS: Not opened file OK\n");
    std::ifstream::close();
    FVar3 = kFileNotFound;
  }
  else {
    dVar5 = getWallTime();
    this->start_time = dVar5;
    this->num_row = 0;
    this->num_col = 0;
    this->num_nz = 0;
    this->cost_row_location = -1;
    this->has_duplicate_row_name_ = false;
    this->has_duplicate_col_name_ = false;
    keyword = kNone;
LAB_002224dd:
    if ((kTimeout < keyword) || ((0x26000000U >> (keyword & (kFixedFormat|kMin)) & 1) == 0)) {
      bVar2 = cannotParseSection(pHVar4,log_options,keyword);
      if (bVar2) goto LAB_002226a0;
      pHVar4 = this;
      switch(keyword) {
      case kObjsense:
        keyword = parseObjsense(this,log_options,&f.super_istream);
        break;
      default:
        keyword = parseDefault(this,log_options,&f.super_istream);
        break;
      case kRows:
        keyword = parseRows(this,log_options,&f.super_istream);
        break;
      case kCols:
        keyword = parseCols(this,log_options,&f.super_istream);
        break;
      case kRhs:
        keyword = parseRhs(this,log_options,&f.super_istream);
        break;
      case kBounds:
        keyword = parseBounds(this,log_options,&f.super_istream);
        break;
      case kRanges:
        keyword = parseRanges(this,log_options,&f.super_istream);
        break;
      case kQsection:
      case kQcmatrix:
        keyword = parseQuadRows(this,log_options,&f.super_istream,keyword);
        break;
      case kQmatrix:
      case kQuadobj:
        keyword = parseHessian(this,log_options,&f.super_istream,keyword);
        break;
      case kCsection:
        keyword = parseCones(this,log_options,&f.super_istream);
        break;
      case kSets:
      case kSos:
        keyword = parseSos(this,log_options,&f.super_istream,keyword);
        break;
      case kFixedFormat:
        goto switchD_0022251a_caseD_1c;
      }
      goto LAB_002224dd;
    }
    for (__n = 0; (long)__n < (long)this->num_col; __n = __n + 1) {
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->col_binary,__n);
      if ((*rVar6._M_p & rVar6._M_mask) != 0) {
        (this->col_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[__n] = 0.0;
        (this->col_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[__n] = 1.0;
      }
    }
    if (keyword != kFail) {
      std::ifstream::close();
      FVar3 = (uint)(keyword == kTimeout) << 2;
      goto LAB_002226a5;
    }
LAB_002226a0:
    std::ifstream::close();
  }
LAB_002226a5:
  zstr::ifstream::~ifstream(&f);
  return FVar3;
switchD_0022251a_caseD_1c:
  std::ifstream::close();
  FVar3 = kFixedFormat;
  goto LAB_002226a5;
}

Assistant:

FreeFormatParserReturnCode HMpsFF::parse(const HighsLogOptions& log_options,
                                         const std::string& filename) {
  HMpsFF::Parsekey keyword = HMpsFF::Parsekey::kNone;

  highsLogDev(log_options, HighsLogType::kInfo,
              "readMPS: Trying to open file %s\n", filename.c_str());
#ifdef ZLIB_FOUND
  zstr::ifstream f;
  try {
    f.open(filename.c_str(), std::ios::in);
  } catch (const strict_fstream::Exception& e) {
    highsLogDev(log_options, HighsLogType::kInfo, e.what());
    return FreeFormatParserReturnCode::kFileNotFound;
  }
#else
  std::ifstream f;
  f.open(filename.c_str(), std::ios::in);
#endif
  if (f.is_open()) {
    start_time = getWallTime();
    num_row = 0;
    num_col = 0;
    num_nz = 0;
    cost_row_location = -1;
    // Indicate that no duplicate rows or columns have been found
    has_duplicate_row_name_ = false;
    has_duplicate_col_name_ = false;
    // parsing loop
    while (keyword != HMpsFF::Parsekey::kFail &&
           keyword != HMpsFF::Parsekey::kEnd &&
           keyword != HMpsFF::Parsekey::kTimeout) {
      if (cannotParseSection(log_options, keyword)) {
        f.close();
        return FreeFormatParserReturnCode::kParserError;
      }
      switch (keyword) {
        case HMpsFF::Parsekey::kObjsense:
          keyword = parseObjsense(log_options, f);
          break;
        case HMpsFF::Parsekey::kRows:
          keyword = parseRows(log_options, f);
          break;
        case HMpsFF::Parsekey::kCols:
          keyword = parseCols(log_options, f);
          break;
        case HMpsFF::Parsekey::kRhs:
          keyword = parseRhs(log_options, f);
          break;
        case HMpsFF::Parsekey::kBounds:
          keyword = parseBounds(log_options, f);
          break;
        case HMpsFF::Parsekey::kRanges:
          keyword = parseRanges(log_options, f);
          break;
        case HMpsFF::Parsekey::kQmatrix:
        case HMpsFF::Parsekey::kQuadobj:
          keyword = parseHessian(log_options, f, keyword);
          break;
        case HMpsFF::Parsekey::kQsection:
        case HMpsFF::Parsekey::kQcmatrix:
          keyword = parseQuadRows(log_options, f, keyword);
          break;
        case HMpsFF::Parsekey::kCsection:
          keyword = parseCones(log_options, f);
          break;
        case HMpsFF::Parsekey::kSets:
        case HMpsFF::Parsekey::kSos:
          keyword = parseSos(log_options, f, keyword);
          break;
        case HMpsFF::Parsekey::kFail:
          f.close();
          return FreeFormatParserReturnCode::kParserError;
        case HMpsFF::Parsekey::kFixedFormat:
          f.close();
          return FreeFormatParserReturnCode::kFixedFormat;
        default:
          keyword = parseDefault(log_options, f);
          break;
      }
    }

    // Assign bounds to columns that remain binary by default
    for (HighsInt colidx = 0; colidx < num_col; colidx++) {
      if (col_binary[colidx]) {
        col_lower[colidx] = 0.0;
        col_upper[colidx] = 1.0;
      }
    }

    if (keyword == HMpsFF::Parsekey::kFail) {
      f.close();
      return FreeFormatParserReturnCode::kParserError;
    }
  } else {
    highsLogDev(log_options, HighsLogType::kInfo,
                "readMPS: Not opened file OK\n");
    f.close();
    return FreeFormatParserReturnCode::kFileNotFound;
  }

  f.close();

  if (keyword == HMpsFF::Parsekey::kTimeout)
    return FreeFormatParserReturnCode::kTimeout;

  assert(col_lower.size() == static_cast<size_t>(num_col));
  assert(row_lower.size() == static_cast<size_t>(num_row));
  return FreeFormatParserReturnCode::kSuccess;
}